

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

void __thiscall
CLI::OptionAlreadyAdded::OptionAlreadyAdded
          (OptionAlreadyAdded *this,string *msg,ExitCodes exit_code)

{
  string local_78;
  allocator local_41;
  string local_40;
  ExitCodes local_1c;
  string *psStack_18;
  ExitCodes exit_code_local;
  string *msg_local;
  OptionAlreadyAdded *this_local;
  
  local_1c = exit_code;
  psStack_18 = msg;
  msg_local = (string *)this;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_40,"OptionAlreadyAdded",&local_41);
  ::std::__cxx11::string::string((string *)&local_78,(string *)msg);
  ConstructionError::ConstructionError(&this->super_ConstructionError,&local_40,&local_78,local_1c);
  ::std::__cxx11::string::~string((string *)&local_78);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  *(undefined ***)&(this->super_ConstructionError).super_Error = &PTR__OptionAlreadyAdded_00409640;
  return;
}

Assistant:

static OptionAlreadyAdded Requires(std::string name, std::string other) {
        return {name + " requires " + other, ExitCodes::OptionAlreadyAdded};
    }